

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void google::protobuf::internal::SwapFieldHelper::SwapRepeatedStringField<false>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  CppStringType CVar6;
  RepeatedField<absl::lts_20250127::Cord> *this;
  RepeatedField<absl::lts_20250127::Cord> *other;
  RepeatedPtrFieldBase *this_00;
  RepeatedPtrFieldBase *other_00;
  SwapFieldHelper local_30 [16];
  
  CVar6 = FieldDescriptor::cpp_string_type(field);
  if ((CVar6 == kView) || (CVar6 == kString)) {
    Reflection::VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(r,field);
    this_00 = (RepeatedPtrFieldBase *)Reflection::MutableRawImpl(r,lhs,field);
    Reflection::VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(r,field);
    other_00 = (RepeatedPtrFieldBase *)Reflection::MutableRawImpl(r,rhs,field);
    if (this_00->arena_ != other_00->arena_) {
      RepeatedPtrFieldBase::
      SwapFallback<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                (this_00,other_00);
      return;
    }
    if (this_00 == other_00) {
      SwapRepeatedStringField<false>(local_30);
    }
    pvVar1 = this_00->tagged_rep_or_elem_;
    iVar4 = this_00->current_size_;
    iVar5 = this_00->capacity_proxy_;
    iVar2 = other_00->current_size_;
    iVar3 = other_00->capacity_proxy_;
    this_00->tagged_rep_or_elem_ = other_00->tagged_rep_or_elem_;
    this_00->current_size_ = iVar2;
    this_00->capacity_proxy_ = iVar3;
    other_00->tagged_rep_or_elem_ = pvVar1;
    other_00->current_size_ = iVar4;
    other_00->capacity_proxy_ = iVar5;
  }
  else if (CVar6 == kCord) {
    Reflection::VerifyFieldType<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>(r,field);
    this = (RepeatedField<absl::lts_20250127::Cord> *)Reflection::MutableRawImpl(r,lhs,field);
    Reflection::VerifyFieldType<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>(r,field);
    other = (RepeatedField<absl::lts_20250127::Cord> *)Reflection::MutableRawImpl(r,rhs,field);
    RepeatedField<absl::lts_20250127::Cord>::Swap(this,other);
    return;
  }
  return;
}

Assistant:

void SwapFieldHelper::SwapRepeatedStringField(const Reflection* r, Message* lhs,
                                              Message* rhs,
                                              const FieldDescriptor* field) {
  switch (field->cpp_string_type()) {
    case FieldDescriptor::CppStringType::kCord: {
      auto* lhs_cord = r->MutableRaw<RepeatedField<absl::Cord>>(lhs, field);
      auto* rhs_cord = r->MutableRaw<RepeatedField<absl::Cord>>(rhs, field);
      if (unsafe_shallow_swap) {
        lhs_cord->InternalSwap(rhs_cord);
      } else {
        lhs_cord->Swap(rhs_cord);
      }
      break;
    }
    case FieldDescriptor::CppStringType::kView:
    case FieldDescriptor::CppStringType::kString: {
      auto* lhs_string = r->MutableRaw<RepeatedPtrFieldBase>(lhs, field);
      auto* rhs_string = r->MutableRaw<RepeatedPtrFieldBase>(rhs, field);
      if (unsafe_shallow_swap) {
        lhs_string->InternalSwap(rhs_string);
      } else {
        lhs_string->Swap<GenericTypeHandler<std::string>>(rhs_string);
      }
      break;
    }
  }
}